

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cpp
# Opt level: O0

Enum * __thiscall cppgenerate::Enum::setName(Enum *this,string *name)

{
  string local_58 [32];
  cppgenerate local_38 [32];
  string *local_18;
  string *name_local;
  Enum *this_local;
  
  local_18 = name;
  name_local = &this->m_name;
  std::__cxx11::string::string(local_58,(string *)name);
  sanitizeString(local_38,(string *)local_58);
  std::__cxx11::string::operator=((string *)this,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string(local_58);
  return this;
}

Assistant:

Enum& Enum::setName( std::string name ){
    m_name = cppgenerate::sanitizeString( name );
    return *this;
}